

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solverational.hpp
# Opt level: O2

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::_ratrecAndOrRatfac
          (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,int *minIRRoundsRemaining,int *lastStallIterations,int *numberOfIterations,
          bool *factorSolNewBasis,int *nextRatrec,Rational *errorCorrectionFactor,
          Rational *errorCorrection,Rational *maxViolation,SolRational *sol,bool *primalFeasible,
          bool *dualFeasible,bool *stoppedTime,bool *stoppedIter,bool *error,bool *breakAfter,
          bool *continueAfter)

{
  SPxOut *_spxout;
  bool bVar1;
  Verbosity VVar2;
  Settings *pSVar3;
  type_conflict5 tVar4;
  bool bVar5;
  byte bVar6;
  Verbosity old_verbosity;
  byte bVar7;
  bool optimal;
  SPxOut *local_60;
  int *local_58;
  int *local_50;
  int *local_48;
  bool *local_40;
  int local_38 [2];
  
  bVar7 = 0;
  *breakAfter = false;
  *continueAfter = false;
  pSVar3 = this->_currentSettings;
  if (pSVar3->_boolParamValues[3] == true) {
    if ((*lastStallIterations < pSVar3->_intParamValues[0x15]) || (this->_hasBasis != true)) {
      bVar7 = 0;
    }
    else {
      bVar7 = *factorSolNewBasis;
    }
  }
  if (pSVar3->_boolParamValues[5] == true) {
    bVar6 = *nextRatrec <= *numberOfIterations | bVar7;
  }
  else {
    bVar6 = 0;
  }
  bVar1 = pSVar3->_boolParamValues[0xc];
  local_58 = minIRRoundsRemaining;
  local_50 = numberOfIterations;
  local_48 = nextRatrec;
  local_40 = factorSolNewBasis;
  boost::
  rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::operator*=((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                *)errorCorrection,
               (rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                *)errorCorrectionFactor);
  if ((bVar6 & 1) != 0) {
    local_38[1] = 0;
    tVar4 = boost::multiprecision::operator>(maxViolation,local_38 + 1);
    if (tVar4) {
      local_60 = &this->spxout;
      VVar2 = (this->spxout).m_verbosity;
      if (2 < (int)VVar2) {
        (this->spxout).m_verbosity = INFO1;
        soplex::operator<<(local_60,"Performing rational reconstruction . . .\n");
        (this->spxout).m_verbosity = VVar2;
      }
      boost::
      rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
      ::operator*=((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                    *)maxViolation,
                   (rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                    *)errorCorrection);
      invert(maxViolation);
      bVar5 = _reconstructSolutionRational
                        (this,sol,&this->_basisStatusRows,&this->_basisStatusCols,maxViolation);
      if (bVar5) {
        VVar2 = (this->spxout).m_verbosity;
        if (2 < (int)VVar2) {
          (this->spxout).m_verbosity = INFO1;
          soplex::operator<<(local_60,"Tolerances reached.\n");
          (this->spxout).m_verbosity = VVar2;
        }
        *primalFeasible = true;
        *dualFeasible = true;
        if ((bVar1 == false) || (this->_hasBasis != false)) goto LAB_002b5d4f;
      }
      *local_48 = (int)((double)*local_50 * this->_currentSettings->_realParamValues[0x11]) + 1;
    }
  }
  if (bVar7 == 0 && bVar1 == false) {
LAB_002b5c04:
    if (bVar1 == false) {
      return;
    }
    if (this->_hasBasis != false) {
      return;
    }
  }
  else {
    local_38[0] = 0;
    tVar4 = boost::multiprecision::operator>(maxViolation,local_38);
    if (!tVar4) goto LAB_002b5c04;
  }
  _spxout = &this->spxout;
  VVar2 = (this->spxout).m_verbosity;
  if (2 < (int)VVar2) {
    (this->spxout).m_verbosity = INFO1;
    soplex::operator<<(_spxout,"Performing rational factorization . . .\n");
    (this->spxout).m_verbosity = VVar2;
  }
  factorizeColumnRational
            (this,sol,&this->_basisStatusRows,&this->_basisStatusCols,stoppedTime,stoppedIter,error,
             &optimal);
  *local_40 = false;
  if (*stoppedTime == true) {
    VVar2 = (this->spxout).m_verbosity;
    if ((int)VVar2 < 3) {
      return;
    }
    (this->spxout).m_verbosity = INFO1;
    soplex::operator<<(_spxout,"Stopped rational factorization.\n");
    (this->spxout).m_verbosity = VVar2;
    return;
  }
  if (*error == true) {
    *error = false;
    return;
  }
  if (optimal == true) {
    VVar2 = (this->spxout).m_verbosity;
    if (2 < (int)VVar2) {
      (this->spxout).m_verbosity = INFO1;
      soplex::operator<<(_spxout,"Tolerances reached.\n");
      (this->spxout).m_verbosity = VVar2;
    }
    *primalFeasible = true;
    *dualFeasible = true;
  }
  else {
    if (this->_currentSettings->_boolParamValues[7] != true) {
      return;
    }
    VVar2 = (this->spxout).m_verbosity;
    if (2 < (int)VVar2) {
      (this->spxout).m_verbosity = INFO1;
      soplex::operator<<(_spxout,"Jumping to exact basic solution.\n");
      (this->spxout).m_verbosity = VVar2;
    }
    *local_58 = *local_58 + 1;
    breakAfter = continueAfter;
  }
LAB_002b5d4f:
  *breakAfter = true;
  return;
}

Assistant:

void SoPlexBase<R>::_ratrecAndOrRatfac(
   int& minIRRoundsRemaining,
   int& lastStallIterations,
   int& numberOfIterations,
   bool& factorSolNewBasis,
   int& nextRatrec,
   const Rational& errorCorrectionFactor,
   Rational& errorCorrection,
   Rational& maxViolation,
   SolRational& sol,
   bool& primalFeasible,
   bool& dualFeasible,
   bool& stoppedTime,
   bool& stoppedIter,
   bool& error,
   bool& breakAfter,
   bool& continueAfter)
{

   ///@todo precision-boosting numberOfIterations is not the best name
   // It is supposed to designate either the number of refinements (when we use iterative refinement) or
   // the number of precision boosts (when not using iterative refinement)
   // numberOfSpecificIterations maybe?

   breakAfter    = false;
   continueAfter = false;

   // decide whether to perform rational reconstruction and/or factorization
   bool forcebasic    = boolParam(SoPlexBase<R>::FORCEBASIC);
   bool performRatfac = boolParam(SoPlexBase<R>::RATFAC)
                        && lastStallIterations >= intParam(SoPlexBase<R>::RATFAC_MINSTALLS) && _hasBasis
                        && factorSolNewBasis;
   bool performRatrec = boolParam(SoPlexBase<R>::RATREC)
                        && (numberOfIterations >= nextRatrec || performRatfac);

   // if we want to force the solution to be basic we need to turn rational factorization on
   performRatfac = performRatfac || forcebasic;

   // attempt rational reconstruction
   errorCorrection *= errorCorrectionFactor;

   if(performRatrec && maxViolation > 0)
   {
      SPX_MSG_INFO1(spxout, spxout << "Performing rational reconstruction . . .\n");

      maxViolation *= errorCorrection; // only used for sign check later
      invert(maxViolation);

      if(_reconstructSolutionRational(sol, _basisStatusRows, _basisStatusCols, maxViolation))
      {
         SPX_MSG_INFO1(spxout, spxout << "Tolerances reached.\n");
         primalFeasible = true;
         dualFeasible = true;

         if(_hasBasis || !forcebasic)
         {
            breakAfter = true;
            return;
         }
      }

      nextRatrec = int(numberOfIterations * realParam(SoPlexBase<R>::RATREC_FREQ)) + 1;

      if(boolParam(SoPlexBase<R>::ITERATIVE_REFINEMENT))
      {
         SPxOut::debug(this, "Next rational reconstruction after refinement {}.\n", nextRatrec);
      }
      else
      {
         assert(boolParam(SoPlexBase<R>::PRECISION_BOOSTING));
         SPxOut::debug(this, "Next rational reconstruction after precision boost {} \n", nextRatrec);
      }
   }

   // solve basis systems exactly
   if((performRatfac && maxViolation > 0) || (!_hasBasis && forcebasic))
   {
      SPX_MSG_INFO1(spxout, spxout << "Performing rational factorization . . .\n");

      bool optimal;
      factorizeColumnRational(sol, _basisStatusRows, _basisStatusCols, stoppedTime, stoppedIter, error,
                              optimal);
      factorSolNewBasis = false;

      if(stoppedTime)
      {
         SPX_MSG_INFO1(spxout, spxout << "Stopped rational factorization.\n");
      }
      else if(error)
      {
         // message was already printed; reset error flag and continue without factorization
         error = false;
      }
      else if(optimal)
      {
         SPX_MSG_INFO1(spxout, spxout << "Tolerances reached.\n");
         primalFeasible = true;
         dualFeasible = true;
         breakAfter = true;
         return;
      }
      else if(boolParam(SoPlexBase<R>::RATFACJUMP))
      {
         SPX_MSG_INFO1(spxout, spxout << "Jumping to exact basic solution.\n");
         minIRRoundsRemaining++;
         continueAfter = true;
         return;
      }
   }
}